

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppFVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  char cVar4;
  options_description_easy_init *poVar5;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar6;
  const_iterator cVar7;
  ostream *poVar8;
  difference_type dVar9;
  char *pcVar10;
  int iVar11;
  bool bVar12;
  undefined1 local_2b8 [8];
  variables_map vm;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_2a8 [8];
  _Rb_tree_node_base local_2a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248 [48];
  undefined1 *local_218;
  options_description desc;
  undefined1 local_208 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_1f0 [24];
  void *local_1d8;
  undefined4 local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined8 local_1b8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_1b0 [24];
  undefined1 local_198 [8];
  positional_options_description pdesc;
  undefined1 *local_180;
  undefined1 local_170 [16];
  undefined1 local_160 [40];
  undefined1 auStack_138 [8];
  Flic flic;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_108 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_e8 [32];
  options_description *local_c8;
  undefined1 local_b8 [8];
  string input;
  directory_iterator local_78;
  directory_iterator local_70;
  directory_iterator local_68;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_60;
  undefined1 local_58 [8];
  string output;
  
  boost::program_options::options_description::options_description
            ((options_description *)&local_218,0x50,0x28);
  local_b8 = (undefined1  [8])&input._M_string_length;
  input._M_dataplus._M_p = (pointer)0x0;
  input._M_string_length._0_1_ = 0;
  local_58 = (undefined1  [8])&output._M_string_length;
  output._M_dataplus._M_p = (pointer)0x0;
  output._M_string_length._0_1_ = 0;
  auStack_138 = (undefined1  [8])
                boost::program_options::options_description::add_options
                          ((options_description *)&local_218);
  poVar5 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)auStack_138,"help","show program help");
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8)
  ;
  poVar5 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar5,"input,i",(value_semantic *)ptVar6,
                      "input path to either a Flic file to decompile or a directory of bitmaps to compile"
                     );
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58)
  ;
  local_2b8 = (undefined1  [8])local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2b8);
  boost::program_options::options_description_easy_init::operator()
            (poVar5,"output,o",(value_semantic *)ptVar6,
             "output path to either the compiled Flic file or a directory to put decompiled frames in"
            );
  if (local_2b8 != (undefined1  [8])local_2a8) {
    operator_delete((void *)local_2b8);
  }
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)local_198);
  boost::program_options::positional_options_description::add
            ((positional_options_description *)local_198,"input",1);
  boost::program_options::positional_options_description::add
            ((positional_options_description *)local_198,"output",2);
  boost::program_options::variables_map::variables_map((variables_map *)local_2b8);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)auStack_138,argc,argv);
  boost::program_options::detail::cmdline::set_options_description
            ((cmdline *)auStack_138,(options_description *)&local_218);
  local_c8 = (options_description *)&local_218;
  boost::program_options::detail::cmdline::set_positional_options
            ((cmdline *)auStack_138,(positional_options_description *)local_198);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_160,(basic_command_line_parser<char> *)auStack_138)
  ;
  boost::program_options::store((basic_parsed_options *)local_160,(variables_map *)local_2b8,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_160);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_e8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_138);
  boost::program_options::notify((variables_map *)local_2b8);
  ppFVar1 = &flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
             super__Vector_impl_data._M_finish;
  auStack_138 = (undefined1  [8])ppFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_138,"input","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_2a8,(key_type *)auStack_138);
  if (cVar7._M_node == &local_2a0) {
    bVar12 = true;
  }
  else {
    local_160._0_8_ = local_160 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"help","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_2a8,(key_type *)local_160);
    bVar12 = cVar7._M_node != &local_2a0;
    if ((pointer)local_160._0_8_ != (pointer)(local_160 + 0x10)) {
      operator_delete((void *)local_160._0_8_);
    }
  }
  if (auStack_138 != (undefined1  [8])ppFVar1) {
    operator_delete((void *)auStack_138);
  }
  if (bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "FlicTool 1.1\nCopyright (c) 2014 Merigrim (https://github.com/Merigrim)\n\n",0x48);
    iVar11 = 1;
    boost::program_options::operator<<((ostream *)&std::cout,(options_description *)&local_218);
    goto LAB_0012415f;
  }
  auStack_138 = (undefined1  [8])ppFVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_138,local_b8,input._M_dataplus._M_p + (long)local_b8);
  boost::filesystem::detail::status
            ((detail *)(input.field_2._M_local_buf + 8),(path *)auStack_138,(error_code *)0x0);
  uVar2 = input.field_2._8_4_;
  if (auStack_138 != (undefined1  [8])ppFVar1) {
    operator_delete((void *)auStack_138);
  }
  if ((uint)uVar2 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: Invalid input path specified: \"",0x26);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_b8,(long)input._M_dataplus._M_p);
    iVar11 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" does not exist.\n",0x12);
    goto LAB_0012415f;
  }
  auStack_138 = (undefined1  [8])ppFVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_138,local_b8,input._M_dataplus._M_p + (long)local_b8);
  boost::filesystem::detail::status
            ((detail *)(input.field_2._M_local_buf + 8),(path *)auStack_138,(error_code *)0x0);
  uVar2 = input.field_2._8_4_;
  if (auStack_138 != (undefined1  [8])ppFVar1) {
    operator_delete((void *)auStack_138);
  }
  if (output._M_dataplus._M_p == (pointer)0x0) {
    pcVar10 = "output";
    if (uVar2 == 3) {
      pcVar10 = "output.flh";
    }
    std::__cxx11::string::_M_replace((ulong)local_58,0,(char *)0x0,(ulong)pcVar10);
  }
  auStack_138 = (undefined1  [8])ppFVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_138,local_58,output._M_dataplus._M_p + (long)local_58);
  boost::filesystem::detail::status
            ((detail *)(input.field_2._M_local_buf + 8),(path *)auStack_138,(error_code *)0x0);
  uVar3 = input.field_2._8_4_;
  if (auStack_138 != (undefined1  [8])ppFVar1) {
    operator_delete((void *)auStack_138);
  }
  if ((uint)uVar3 < 2) {
    if (uVar2 != 3) {
      auStack_138 = (undefined1  [8])ppFVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_138,local_58,output._M_dataplus._M_p + (long)local_58);
      cVar4 = boost::filesystem::detail::create_directories((path *)auStack_138,(error_code *)0x0);
      if (auStack_138 != (undefined1  [8])ppFVar1) {
        operator_delete((void *)auStack_138);
      }
      if (cVar4 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: Unable to create output directory \"",0x2a);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_58,(long)output._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\". Please make sure that your permissions are set up correctly.",0x3f);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        iVar11 = 1;
        std::ostream::flush();
        goto LAB_0012415f;
      }
      goto LAB_00124101;
    }
LAB_0012411c:
    flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_138 = (undefined1  [8])0x0;
    Flic::compile((Flic *)auStack_138,(string *)local_b8,(string *)local_58);
LAB_0012414c:
    if (auStack_138 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_138);
    }
  }
  else {
    auStack_138 = (undefined1  [8])ppFVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_138,local_58,output._M_dataplus._M_p + (long)local_58);
    boost::filesystem::detail::status
              ((detail *)(input.field_2._M_local_buf + 8),(path *)auStack_138,(error_code *)0x0);
    uVar3 = input.field_2._8_4_;
    if (auStack_138 != (undefined1  [8])ppFVar1) {
      operator_delete((void *)auStack_138);
    }
    if (uVar3 != 2) {
      auStack_138 = (undefined1  [8])ppFVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_138,local_58,output._M_dataplus._M_p + (long)local_58);
      boost::filesystem::detail::status
                ((detail *)(input.field_2._M_local_buf + 8),(path *)auStack_138,(error_code *)0x0);
      uVar3 = input.field_2._8_4_;
      if (auStack_138 != (undefined1  [8])ppFVar1) {
        operator_delete((void *)auStack_138);
      }
      if (uVar3 == 3) {
        input.field_2._8_8_ = &stack0xffffffffffffff78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&input.field_2 + 8),local_58,
                   output._M_dataplus._M_p + (long)local_58);
        boost::filesystem::directory_iterator::directory_iterator
                  (&local_68,(path *)((long)&input.field_2 + 8),none);
        local_60.px = (dir_itr_imp *)0x0;
        local_78.m_imp.px = local_68.m_imp.px;
        if (local_68.m_imp.px != (dir_itr_imp *)0x0) {
          LOCK();
          *(int *)local_68.m_imp.px = *(int *)local_68.m_imp.px + 1;
          UNLOCK();
        }
        local_70.m_imp.px =
             (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
        auStack_138 = (undefined1  [8])boost::filesystem::is_regular_file;
        flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)boost::filesystem::directory_entry::path;
        flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        dVar9 = std::
                __count_if<boost::filesystem::directory_iterator,__gnu_cxx::__ops::_Iter_pred<std::_Bind<bool(*(std::_Bind<boost::filesystem::path_const&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()const>))(boost::filesystem::path_const&)>>>
                          (&local_78,&local_70,
                           (_Iter_pred<std::_Bind<bool_(*(std::_Bind<const_boost::filesystem::path_&(boost::filesystem::directory_entry::*(std::_Placeholder<1>))()_const>))(const_boost::filesystem::path_&)>_>
                            *)auStack_138);
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                  (&local_70.m_imp);
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                  (&local_78.m_imp);
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_60);
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                  (&local_68.m_imp);
        if ((undefined1 *)input.field_2._8_8_ != &stack0xffffffffffffff78) {
          operator_delete((void *)input.field_2._8_8_);
        }
        if (0 < (int)dVar9) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warning: Output directory \"",0x1b);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_58,(long)output._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,
                     "\" isn\'t empty. Overwrite any existing frames (if there are any)? (Y to overwrite, default: no) "
                     ,0x5f);
          bVar12 = prompt();
          goto LAB_001240fd;
        }
      }
LAB_00124101:
      auStack_138 = (undefined1  [8])0x0;
      flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      flic.frames_.super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (uVar2 == 3) goto LAB_0012411c;
      Flic::decompile((Flic *)auStack_138,(string *)local_b8,(string *)local_58);
      goto LAB_0012414c;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Warning: Output file \"",0x16);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_58,(long)output._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"\" already exists. Overwrite it? (Y to overwrite, default: no) ",0x3e);
    bVar12 = prompt();
LAB_001240fd:
    if (bVar12 != false) goto LAB_00124101;
  }
  iVar11 = 0;
LAB_0012415f:
  local_2b8 = (undefined1  [8])&PTR__variables_map_0018d088;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_248);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_278);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_2a8);
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_198);
  if (local_58 != (undefined1  [8])&output._M_string_length) {
    operator_delete((void *)local_58);
  }
  if (local_b8 != (undefined1  [8])&input._M_string_length) {
    operator_delete((void *)local_b8);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_1b0);
  if (local_1d8 != (void *)0x0) {
    operator_delete(local_1d8);
    local_1d8 = (void *)0x0;
    local_1d0 = 0;
    local_1c8 = 0;
    local_1c0 = 0;
    local_1b8 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_1f0);
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  return iVar11;
}

Assistant:

int main(int argc, char **argv) {
	po::options_description desc;
	std::string input, output;
	desc.add_options()
		("help", "show program help")
		("input,i", po::value<std::string>(&input), "input path to either a Flic file to decompile or a directory of bitmaps to compile")
		("output,o", po::value<std::string>(&output)->default_value(""), "output path to either the compiled Flic file or a directory to put decompiled frames in")
	;
	po::positional_options_description pdesc;
	pdesc.add("input", 1);
	pdesc.add("output", 2);

	po::variables_map vm;
	try {
		po::store(po::command_line_parser(argc, argv).options(desc).positional(pdesc).run(), vm);
	} catch (po::unknown_option &e) {
		showHelp(desc);
		return 1;
	}
	po::notify(vm);

	// If the user has forgotten to write any arguments or explicitly requested help
	if (!vm.count("input") || vm.count("help")) {
		showHelp(desc);
		return 1;
	}

	// Make sure the input path actually exists
	if (!fs::exists(input)) {
		std::cerr << "Error: Invalid input path specified: \"" << input << "\" does not exist.\n";
		return 1;
	}

	bool compiling = fs::is_directory(input);
	
	if (output.empty()) {
		// We need different default output filenames depending on the desired action
		if (compiling) {
			output = "output.flh";
		} else {
			output = "output";
		}
	}

	if (fs::exists(output)) {
		// We need to check if the user is about to accidentally overwrite already existing files
		if (fs::is_regular_file(output)) {
			std::cout << "Warning: Output file \"" << output << "\" already exists. Overwrite it? (Y to overwrite, default: no) ";
			if (!prompt()) {
				return 0;
			}
		} else if (fs::is_directory(output)) {
			// Check if there are any files in the output directory. Instead of looping through an
			// unknown number of files and checking file names, we just check if the folder isn't
			// empty, in which case we warn the user
			int count = std::count_if(fs::directory_iterator(output), fs::directory_iterator(),
						std::bind(static_cast<bool(*)(const fs::path&)>(fs::is_regular_file), 
						std::bind(&fs::directory_entry::path, std::placeholders::_1)));
			if (count > 0) {
				std::cout << "Warning: Output directory \"" << output << "\" isn't empty. Overwrite any existing frames (if there are any)? (Y to overwrite, default: no) ";
				if (!prompt()) {
					return 0;
				}
			}
		}
	} else if (!compiling) { // If we're decompiling but the output directory doesn't exist, we need to create it
		if (!fs::create_directories(output)) {
			std::cerr << "Error: Unable to create output directory \"" << output << "\". Please make sure that your permissions are set up correctly." << std::endl;
			return 1;
		}
	}

	Flic flic;
	if (compiling) {
		flic.compile(input, output);
	} else {
		flic.decompile(input, output);
	}

	return 0;
}